

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

int __thiscall TPZSkylMatrix<double>::Clear(TPZSkylMatrix<double> *this)

{
  TPZVec<double>::Resize(&this->fStorage,0);
  TPZVec<double_*>::Resize(&this->fElem,0);
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\0';
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Clear()
{
    this->fStorage.Resize(0);
    //	fStorage.Shrink();
    this->fElem.Resize(0);
    this->fRow = this->fCol = 0;
    this->fDecomposed = 0;
    return( 1 );
}